

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOOpen(FmsIOContext *ctx,char *filename,char *mode)

{
  FILE *pFVar1;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 1;
  }
  else if (in_RSI == (char *)0x0) {
    local_4 = 2;
  }
  else if (in_RDX == (char *)0x0) {
    local_4 = 3;
  }
  else {
    pFVar1 = fopen(in_RSI,in_RDX);
    *in_RDI = (long)pFVar1;
    if (*in_RDI == 0) {
      local_4 = 4;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOOpen(FmsIOContext *ctx, const char *filename, const char *mode) {
  if(!ctx) E_RETURN(1);
  if(!filename) E_RETURN(2);
  if(!mode) E_RETURN(3);
  ctx->fp = fopen(filename, mode);
  if(!ctx->fp) E_RETURN(4);
  return 0;
}